

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TablePopBackgroundChannel(void)

{
  ImVec4 *pIVar1;
  ImGuiTable *pIVar2;
  ImGuiWindow *pIVar3;
  ImDrawList *pIVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiTableColumn *pIVar8;
  
  pIVar2 = GImGui->CurrentTable;
  if ((-1 < (long)pIVar2->CurrentColumn) &&
     (pIVar8 = (pIVar2->Columns).Data + pIVar2->CurrentColumn, pIVar8 < (pIVar2->Columns).DataEnd))
  {
    pIVar3 = GImGui->CurrentWindow;
    IVar5 = (pIVar2->HostBackupInnerClipRect).Min;
    IVar6 = (pIVar2->HostBackupInnerClipRect).Max;
    IVar7 = (pIVar2->HostBackupInnerClipRect).Max;
    (pIVar3->ClipRect).Min = (pIVar2->HostBackupInnerClipRect).Min;
    (pIVar3->ClipRect).Max = IVar7;
    pIVar4 = pIVar3->DrawList;
    (pIVar4->_CmdHeader).ClipRect.x = IVar5.x;
    (pIVar4->_CmdHeader).ClipRect.y = IVar5.y;
    (pIVar4->_CmdHeader).ClipRect.z = IVar6.x;
    (pIVar4->_CmdHeader).ClipRect.w = IVar6.y;
    pIVar1 = (pIVar3->DrawList->_ClipRectStack).Data +
             (long)(pIVar3->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar5.x;
    pIVar1->y = IVar5.y;
    pIVar1->z = IVar6.x;
    pIVar1->w = IVar6.y;
    ImDrawListSplitter::SetCurrentChannel
              (&pIVar2->DrawSplitter,pIVar3->DrawList,(uint)pIVar8->DrawChannelCurrent);
    return;
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_internal.h"
                ,0x20c,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
}

Assistant:

void ImGui::TablePopBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupInnerClipRect);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}